

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O1

void __thiscall ser::FieldsTable::TableFromJSON(FieldsTable *this,JSONNode *node)

{
  internalJSONNode *piVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  DataFieldInfo info;
  DataFieldInfo local_d8;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
           *)this);
  piVar1 = node->internal;
  if ((piVar1->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(piVar1);
    ppJVar3 = piVar1->Children->array;
  }
  else {
    ppJVar3 = (JSONNode **)0x0;
  }
  while( true ) {
    piVar1 = node->internal;
    if ((piVar1->_type & 0xfe) == 4) {
      internalJSONNode::Fetch(piVar1);
      ppJVar2 = piVar1->Children->array + piVar1->Children->mysize;
    }
    else {
      ppJVar2 = (JSONNode **)0x0;
    }
    if (ppJVar3 == ppJVar2) break;
    DataFieldInfo::DataFieldInfo(&local_d8);
    DataFieldInfo::FromJSON(&local_d8,*ppJVar3);
    RegisterField(this,&local_d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                 *)&local_d8.metainfo_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.type_._M_dataplus._M_p != &local_d8.type_.field_2) {
      operator_delete(local_d8.type_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.name_._M_dataplus._M_p != &local_d8.name_.field_2) {
      operator_delete(local_d8.name_._M_dataplus._M_p);
    }
    ppJVar3 = ppJVar3 + 1;
  }
  return;
}

Assistant:

void FieldsTable::TableFromJSON(const JSONNode& node)
{
    Cleanup();

    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
    {
        DataFieldInfo info;
        info.FromJSON(*iter);
        RegisterField(info);
    }
}